

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

int __thiscall
CVmObjFrameDesc::getp_get_targprop
          (CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  vm_prop_id_t vVar4;
  int iVar5;
  vm_prop_id_t *pvVar6;
  
  if (getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_targprop();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_targprop::desc);
  if (iVar5 != 0) {
    return 1;
  }
  uVar1 = *(uint *)(this->super_CVmObject).ext_;
  plVar2 = *(long **)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8);
  lVar3 = *plVar2;
  if (lVar3 == 0) {
    pvVar6 = (vm_prop_id_t *)(plVar2 + 8);
  }
  else {
    if (*(int *)(lVar3 + -0xb0) == 1) {
      vVar4 = 0;
      goto LAB_0029656b;
    }
    pvVar6 = (vm_prop_id_t *)(lVar3 + -0xa8);
  }
  vVar4 = *pvVar6;
LAB_0029656b:
  if (vVar4 == 0) {
    retval->typ = VM_NIL;
  }
  else {
    retval->typ = VM_PROP;
    (retval->val).prop = vVar4;
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_targprop(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                       uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'targetprop' from the frame */
    get_frame_ref(vmg0_)->get_targprop(vmg_ retval);

    /* handled */
    return TRUE;
}